

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::CartesianProductGenerator<const_trust_token_method_st_*,_bool>::
IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_>::IteratorImpl
          (IteratorImpl<std::integer_sequence<unsigned_long,_0UL,_1UL>_> *this,
          ParamGeneratorInterface<std::tuple<const_trust_token_method_st_*,_bool>_> *base,
          tuple<testing::internal::ParamGenerator<const_trust_token_method_st_*>,_testing::internal::ParamGenerator<bool>_>
          *generators,bool is_end)

{
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _Tuple_impl<0UL,_testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>_>
  *p_Var1;
  ParamIterator<const_trust_token_method_st_*> local_40;
  ParamIterator<bool> local_38;
  
  (this->super_ParamIteratorInterface<std::tuple<const_trust_token_method_st_*,_bool>_>).
  _vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_0068fe00;
  this->base_ = base;
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_*,_false>
  ._M_head_impl._0_4_ =
       (*((generators->
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_trust_token_method_st_*>,_testing::internal::ParamGenerator<bool>_>
          ).
          super__Head_base<0UL,_testing::internal::ParamGenerator<const_trust_token_method_st_*>,_false>
          ._M_head_impl.impl_.
          super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_trust_token_method_st_*>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_*,_false>
  ._M_head_impl._4_4_ = extraout_var;
  local_38.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bool>,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_false>._M_head_impl =
       (unique_ptr<testing::internal::ParamIteratorInterface<bool>,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
        )(**(code **)(*(long *)(generators->
                               super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_trust_token_method_st_*>,_testing::internal::ParamGenerator<bool>_>
                               ).super__Tuple_impl<1UL,_testing::internal::ParamGenerator<bool>_>.
                               super__Head_base<1UL,_testing::internal::ParamGenerator<bool>,_false>
                               ._M_head_impl.impl_.
                               super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + 0x10))();
  std::
  _Tuple_impl<0ul,testing::internal::ParamIterator<trust_token_method_st_const*>,testing::internal::ParamIterator<bool>>
  ::
  _Tuple_impl<testing::internal::ParamIterator<trust_token_method_st_const*>,testing::internal::ParamIterator<bool>,void>
            ((_Tuple_impl<0ul,testing::internal::ParamIterator<trust_token_method_st_const*>,testing::internal::ParamIterator<bool>>
              *)&this->begin_,&local_40,&local_38);
  if (local_38.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bool>,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_false>._M_head_impl
      != (__uniq_ptr_data<testing::internal::ParamIteratorInterface<bool>,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>,_true,_true>
          )0x0) {
    (**(code **)(*(long *)local_38.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bool>,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_40.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_40.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_*,_false>
                          ._M_head_impl + 8))();
  }
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_*,_false>
  ._M_head_impl._0_4_ =
       (*((generators->
          super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_trust_token_method_st_*>,_testing::internal::ParamGenerator<bool>_>
          ).
          super__Head_base<0UL,_testing::internal::ParamGenerator<const_trust_token_method_st_*>,_false>
          ._M_head_impl.impl_.
          super___shared_ptr<const_testing::internal::ParamGeneratorInterface<const_trust_token_method_st_*>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
  local_40.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_>_>
  .
  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_*,_false>
  ._M_head_impl._4_4_ = extraout_var_00;
  local_38.impl_._M_t.
  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bool>,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
  .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_false>._M_head_impl =
       (unique_ptr<testing::internal::ParamIteratorInterface<bool>,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
        )(**(code **)(*(long *)(generators->
                               super__Tuple_impl<0UL,_testing::internal::ParamGenerator<const_trust_token_method_st_*>,_testing::internal::ParamGenerator<bool>_>
                               ).super__Tuple_impl<1UL,_testing::internal::ParamGenerator<bool>_>.
                               super__Head_base<1UL,_testing::internal::ParamGenerator<bool>,_false>
                               ._M_head_impl.impl_.
                               super___shared_ptr<const_testing::internal::ParamGeneratorInterface<bool>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr + 0x18))();
  std::
  _Tuple_impl<0ul,testing::internal::ParamIterator<trust_token_method_st_const*>,testing::internal::ParamIterator<bool>>
  ::
  _Tuple_impl<testing::internal::ParamIterator<trust_token_method_st_const*>,testing::internal::ParamIterator<bool>,void>
            ((_Tuple_impl<0ul,testing::internal::ParamIterator<trust_token_method_st_const*>,testing::internal::ParamIterator<bool>>
              *)&this->end_,&local_40,&local_38);
  if (local_38.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bool>,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
      .super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_false>._M_head_impl
      != (__uniq_ptr_data<testing::internal::ParamIteratorInterface<bool>,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>,_true,_true>
          )0x0) {
    (**(code **)(*(long *)local_38.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<bool>,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_std::default_delete<testing::internal::ParamIteratorInterface<bool>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<bool>_*,_false>
                          ._M_head_impl + 8))();
  }
  if (local_40.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_40.impl_._M_t.
                          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_>_>
                          .
                          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_trust_token_method_st_*>_*,_false>
                          ._M_head_impl + 8))();
  }
  p_Var1 = &(this->begin_).
            super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>_>
  ;
  if (is_end) {
    p_Var1 = &(this->end_).
              super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>_>
    ;
  }
  std::
  _Tuple_impl<0UL,_testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>_>
  ::_Tuple_impl(&(this->current_).
                 super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_trust_token_method_st_*>,_testing::internal::ParamIterator<bool>_>
                ,p_Var1);
  (this->current_value_).
  super___shared_ptr<std::tuple<const_trust_token_method_st_*,_bool>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->current_value_).
  super___shared_ptr<std::tuple<const_trust_token_method_st_*,_bool>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ComputeCurrentValue(this);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }